

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool EqualsIgnoreCase(string *s1,string *s2,locale *loc)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  bool bVar1;
  anon_class_8_1_a7c3953d __binary_pred;
  
  __binary_pred.ctype = (ctype<char> *)std::use_facet<std::ctype<char>>(loc);
  if (s1->_M_string_length == s2->_M_string_length) {
    __first1._M_current = (s1->_M_dataplus)._M_p;
    bVar1 = std::
            equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,EqualsIgnoreCase(std::__cxx11::string_const&,std::__cxx11::string_const&,std::locale_const&)::_lambda(char,char)_1_>
                      (__first1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(__first1._M_current + s1->_M_string_length),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(s2->_M_dataplus)._M_p,__binary_pred);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool EqualsIgnoreCase(const std::string& s1, const std::string& s2, const std::locale& loc = std::locale()) {
    const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
    const auto compareCharLower = [&](char c1, char c2) { return ctype.tolower(c1) == ctype.tolower(c2); };
    return s1.size() == s2.size() && std::equal(s1.begin(), s1.end(), s2.begin(), compareCharLower);
}